

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testError.cpp
# Opt level: O1

void anon_unknown.dwarf_112d7f::testNormalizedRounding(int n)

{
  char cVar1;
  uint uVar2;
  ostream *poVar3;
  byte bVar4;
  float fVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float local_50;
  float local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"rounding normalized numbers to ",0x1f);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,n);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-bit precision\n",0xf);
  local_48 = 0.0;
  local_50 = 0.0;
  if (n < 10) {
    local_50 = (float)(double)(((ulong)(10 - n) << 0x34) + 0x3f3ffffaa19c4774);
  }
  iVar7 = 200000;
  uVar6 = 0;
  do {
    fVar10 = drand();
    fVar5 = ABS(fVar10 * 65504.0);
    uVar2 = (uint)(fVar10 * 65504.0) >> 0x10 & 0x8000;
    if ((uint)fVar5 < 0x38800000) {
      if ((0x33000000 < (uint)fVar5) &&
         (uVar9 = (uint)fVar5 & 0x7fffff | 0x800000, cVar1 = (char)((uint)fVar5 >> 0x17),
         uVar2 = uVar2 | uVar9 >> (0x7eU - cVar1 & 0x1f),
         0x80000000 < uVar9 << (cVar1 + 0xa2U & 0x1f))) {
        uVar2 = uVar2 + 1;
      }
    }
    else if ((uint)fVar5 < 0x7f800000) {
      if ((uint)fVar5 < 0x477ff000) {
        uVar2 = (int)fVar5 + 0x8000fff + (uint)(((uint)fVar5 >> 0xd & 1) != 0) >> 0xd | uVar2;
      }
      else {
        uVar2 = uVar2 | 0x7c00;
      }
    }
    else {
      uVar2 = uVar2 | 0x7c00;
      if (fVar5 != INFINITY) {
        uVar9 = (uint)fVar5 >> 0xd & 0x3ff;
        uVar2 = uVar2 | uVar9 | (uint)(uVar9 == 0);
      }
    }
    fVar5 = local_48;
    if (6.1035156e-05 <= *(float *)(_imath_half_to_float_table + (ulong)(uVar2 & 0xffff) * 4)) {
      uVar8 = uVar2 ^ uVar6;
      uVar9 = uVar8;
      if ((uint)n < 10) {
        bVar4 = (byte)(9U - n);
        uVar2 = ((uVar2 & 0x7fff) >> (bVar4 & 0x1f)) +
                (uint)(((uVar2 & 0x7fff) >> (9U - n & 0x1f) & 1) != 0) << (bVar4 & 0x1f);
        uVar9 = uVar8 & -1 << (10U - (char)n & 0x1f);
        if ((uVar2 & 0xfc00) < 0x7c00) {
          uVar9 = uVar2;
        }
        uVar9 = uVar9 | uVar8 & 0xffff8000;
      }
      fVar10 = 1.0 - *(float *)(_imath_half_to_float_table + (ulong)(uVar9 & 0xffff) * 4) /
                     *(float *)(_imath_half_to_float_table + (ulong)(uVar8 & 0xffff) * 4);
      fVar5 = -fVar10;
      if (-fVar10 <= fVar10) {
        fVar5 = fVar10;
      }
      if (local_50 < fVar5) {
        poVar3 = std::operator<<((ostream *)&std::cout,"half = ");
        poVar3 = (ostream *)operator<<(poVar3,(half)(uint16_t)uVar8);
        poVar3 = std::operator<<(poVar3,", rounded = ");
        poVar3 = (ostream *)operator<<(poVar3,(half)(uint16_t)uVar9);
        poVar3 = std::operator<<(poVar3,", error = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
        poVar3 = std::operator<<(poVar3,", expected error = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_50);
        std::endl<char,std::char_traits<char>>(poVar3);
        printBits((ostream *)&std::cout,(half)(uint16_t)uVar8);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        printBits((ostream *)&std::cout,(half)(uint16_t)uVar9);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testError.cpp"
                      ,0x89,"void (anonymous namespace)::testNormalizedRounding(int)");
      }
      if (fVar5 <= local_48) {
        fVar5 = local_48;
      }
    }
    local_48 = fVar5;
    uVar6 = uVar6 - 0x8000;
    iVar7 = iVar7 + -1;
    if (iVar7 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"max error          = ",0x15);
      poVar3 = std::ostream::_M_insert<double>((double)local_48);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"max expected error = ",0x15);
      poVar3 = std::ostream::_M_insert<double>((double)local_50);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n\n",4);
      std::ostream::flush();
      return;
    }
  } while( true );
}

Assistant:

void
testNormalizedRounding (int n)
{
    cout << "rounding normalized numbers to " << n << "-bit precision\n";

    float eExpected = (n < 10) ? HALF_EPSILON * 0.5f * (1 << (10 - n)) : 0;
    float eMax      = 0;

    for (int i = 0; i < 200000; i++)
    {
        half h (drand () * HALF_MAX);

        if (h < HALF_NRM_MIN) continue;

        if (i & 1) h = -h;

        half  r (h.round (n));
        float e = 1.0f - r / h;

        if (e < 0) e = -e;

        if (e > eExpected)
        {
            cout << "half = " << h << ", rounded = " << r << ", error = " << e
                 << ", expected error = " << eExpected << endl;

            printBits (cout, h);
            cout << endl;
            printBits (cout, r);
            cout << endl;

            assert (false);
        }

        if (e > eMax) eMax = e;
    }

    cout << "max error          = " << eMax << endl;
    cout << "max expected error = " << eExpected << endl;
    cout << "ok\n\n" << flush;
}